

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

char * upb_MtDataEncoder_EncodeExtension
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType type,uint32_t field_num,
                 uint64_t field_mod)

{
  upb_MtDataEncoderInternal *puVar1;
  char *ptr_00;
  upb_MtDataEncoderInternal *in;
  uint64_t field_mod_local;
  uint32_t field_num_local;
  upb_FieldType type_local;
  char *ptr_local;
  upb_MtDataEncoder *e_local;
  
  puVar1 = upb_MtDataEncoder_GetInternal(e,ptr);
  (puVar1->state).enum_state.present_values_mask = 0;
  (puVar1->state).enum_state.last_written_value = 0;
  (puVar1->state).msg_state.oneof_state = kUpb_OneofState_NotStarted;
  ptr_00 = upb_MtDataEncoder_PutRaw(e,ptr,'#');
  if (ptr_00 == (char *)0x0) {
    e_local = (upb_MtDataEncoder *)0x0;
  }
  else {
    e_local = (upb_MtDataEncoder *)upb_MtDataEncoder_PutField(e,ptr_00,type,field_num,field_mod);
  }
  return (char *)e_local;
}

Assistant:

char* upb_MtDataEncoder_EncodeExtension(upb_MtDataEncoder* e, char* ptr,
                                        upb_FieldType type, uint32_t field_num,
                                        uint64_t field_mod) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  in->state.msg_state.msg_modifiers = 0;
  in->state.msg_state.last_field_num = 0;
  in->state.msg_state.oneof_state = kUpb_OneofState_NotStarted;

  ptr = upb_MtDataEncoder_PutRaw(e, ptr, kUpb_EncodedVersion_ExtensionV1);
  if (!ptr) return NULL;

  return upb_MtDataEncoder_PutField(e, ptr, type, field_num, field_mod);
}